

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_shader * rf_gfx_load_shader(rf_shader *__return_storage_ptr__,char *vs_code,char *fs_code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  rf_int i;
  long lVar5;
  rf_context *prVar6;
  int namelen;
  uint type;
  int num;
  int uniform_count;
  rf_shader *local_170;
  char *local_168;
  char *pcStack_160;
  undefined8 local_158;
  char *local_150;
  char *pcStack_148;
  undefined8 local_140;
  char name [256];
  
  __return_storage_ptr__->locs[0x1c] = -1;
  __return_storage_ptr__->locs[0x1d] = -1;
  __return_storage_ptr__->locs[0x1e] = -1;
  __return_storage_ptr__->locs[0x1f] = -1;
  __return_storage_ptr__->locs[0x18] = -1;
  __return_storage_ptr__->locs[0x19] = -1;
  __return_storage_ptr__->locs[0x1a] = -1;
  __return_storage_ptr__->locs[0x1b] = -1;
  __return_storage_ptr__->locs[0x14] = -1;
  __return_storage_ptr__->locs[0x15] = -1;
  __return_storage_ptr__->locs[0x16] = -1;
  __return_storage_ptr__->locs[0x17] = -1;
  __return_storage_ptr__->locs[0x10] = -1;
  __return_storage_ptr__->locs[0x11] = -1;
  __return_storage_ptr__->locs[0x12] = -1;
  __return_storage_ptr__->locs[0x13] = -1;
  __return_storage_ptr__->locs[0xc] = -1;
  __return_storage_ptr__->locs[0xd] = -1;
  __return_storage_ptr__->locs[0xe] = -1;
  __return_storage_ptr__->locs[0xf] = -1;
  __return_storage_ptr__->locs[8] = -1;
  __return_storage_ptr__->locs[9] = -1;
  __return_storage_ptr__->locs[10] = -1;
  __return_storage_ptr__->locs[0xb] = -1;
  __return_storage_ptr__->locs[4] = -1;
  __return_storage_ptr__->locs[5] = -1;
  __return_storage_ptr__->locs[6] = -1;
  __return_storage_ptr__->locs[7] = -1;
  uVar2 = (rf__ctx->field_0).default_frag_shader_id;
  if (vs_code == (char *)0x0) {
    uVar1 = (rf__ctx->field_0).default_vertex_shader_id;
  }
  else {
    uVar1 = rf_compile_shader(vs_code,0x8b31);
  }
  if (fs_code != (char *)0x0) {
    uVar2 = rf_compile_shader(fs_code,0x8b30);
  }
  prVar6 = rf__ctx;
  if ((uVar1 == (rf__ctx->field_0).default_vertex_shader_id) &&
     (uVar2 == (rf__ctx->field_0).default_frag_shader_id)) {
    memcpy(__return_storage_ptr__,&(rf__ctx->field_0).default_shader,0x84);
    uVar2 = __return_storage_ptr__->id;
  }
  else {
    uVar3 = rf_load_shader_program(uVar1,uVar2);
    __return_storage_ptr__->id = uVar3;
    if (uVar1 != (rf__ctx->field_0).default_vertex_shader_id) {
      (*(rf__ctx->field_0).gfx_ctx.gl.DeleteShader)(uVar1);
    }
    if (uVar2 != (rf__ctx->field_0).default_frag_shader_id) {
      (*(rf__ctx->field_0).gfx_ctx.gl.DeleteShader)(uVar2);
    }
    prVar6 = rf__ctx;
    if (uVar3 == 0) {
      local_150 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_148 = "rf_gfx_load_shader";
      local_140 = 0x9a25;
      uVar2 = 0;
      rf_log_impl(4,0x173ff3);
      prVar6 = rf__ctx;
      memcpy(__return_storage_ptr__,&(rf__ctx->field_0).default_shader,0x84);
      uVar3 = __return_storage_ptr__->id;
      if (__return_storage_ptr__->id == 0) goto LAB_0014ec74;
    }
    uVar2 = uVar3;
    iVar4 = (*(prVar6->field_0).gfx_ctx.gl.GetAttribLocation)(uVar2,"vertex_position");
    __return_storage_ptr__->locs[0] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetAttribLocation)(uVar2,"vertex_tex_coord");
    __return_storage_ptr__->locs[1] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetAttribLocation)(uVar2,"vertex_tex_coord2");
    __return_storage_ptr__->locs[2] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetAttribLocation)(uVar2,"vertex_normal");
    __return_storage_ptr__->locs[3] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetAttribLocation)(uVar2,"vertex_tangent");
    __return_storage_ptr__->locs[4] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetAttribLocation)(uVar2,"vertex_color");
    __return_storage_ptr__->locs[5] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetUniformLocation)(uVar2,"mvp");
    __return_storage_ptr__->locs[6] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetUniformLocation)(uVar2,"projection");
    __return_storage_ptr__->locs[9] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetUniformLocation)(uVar2,"view");
    __return_storage_ptr__->locs[8] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetUniformLocation)(uVar2,"col_diffuse");
    __return_storage_ptr__->locs[0xb] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetUniformLocation)(uVar2,"texture0");
    __return_storage_ptr__->locs[0xe] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetUniformLocation)(uVar2,"texture1");
    __return_storage_ptr__->locs[0xf] = iVar4;
    iVar4 = (*(rf__ctx->field_0).gfx_ctx.gl.GetUniformLocation)(uVar2,"texture2");
    __return_storage_ptr__->locs[0x10] = iVar4;
    prVar6 = rf__ctx;
  }
LAB_0014ec74:
  uniform_count = -1;
  local_170 = __return_storage_ptr__;
  (*(prVar6->field_0).gfx_ctx.gl.GetProgramiv)(uVar2,0x8b86,&uniform_count);
  for (lVar5 = 0; lVar5 < uniform_count; lVar5 = lVar5 + 1) {
    namelen = -1;
    num = -1;
    type = 0;
    (*(rf__ctx->field_0).gfx_ctx.gl.GetActiveUniform)
              (uVar2,(uint)lVar5,0xff,&namelen,&num,&type,name);
    name[namelen] = '\0';
    uVar1 = (*(rf__ctx->field_0).gfx_ctx.gl.GetUniformLocation)(uVar2,name);
    local_168 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_160 = "rf_gfx_load_shader";
    local_158 = 0x9a42;
    rf_log_impl(1,0x174015,(char *)(ulong)uVar2,name,(ulong)uVar1);
  }
  return local_170;
}

Assistant:

RF_API rf_shader rf_gfx_load_shader(const char* vs_code, const char* fs_code)
{
    rf_shader shader = { 0 };
    memset(shader.locs, -1, sizeof(shader.locs));

    unsigned int vertex_shader_id   = rf_ctx.default_vertex_shader_id;
    unsigned int fragment_shader_id = rf_ctx.default_frag_shader_id;

    if (vs_code != NULL) vertex_shader_id   = rf_compile_shader(vs_code, GL_VERTEX_SHADER);
    if (fs_code != NULL) fragment_shader_id = rf_compile_shader(fs_code, GL_FRAGMENT_SHADER);

    if ((vertex_shader_id == rf_ctx.default_vertex_shader_id) && (fragment_shader_id == rf_ctx.default_frag_shader_id)) shader = rf_ctx.default_shader;
    else
    {
        shader.id = rf_load_shader_program(vertex_shader_id, fragment_shader_id);

        if (vertex_shader_id != rf_ctx.default_vertex_shader_id) rf_gl.DeleteShader(vertex_shader_id);
        if (fragment_shader_id != rf_ctx.default_frag_shader_id) rf_gl.DeleteShader(fragment_shader_id);

        if (shader.id == 0)
        {
            RF_LOG(RF_LOG_TYPE_WARNING, "Custom shader could not be loaded");
            shader = rf_ctx.default_shader;
        }

        // After shader loading, we TRY to set default location names
        if (shader.id > 0) rf_set_shader_default_locations(&shader);
    }

    // Get available shader uniforms
    // NOTE: This information is useful for debug...
    int uniform_count = -1;

    rf_gl.GetProgramiv(shader.id, GL_ACTIVE_UNIFORMS, &uniform_count);

    for (rf_int i = 0; i < uniform_count; i++)
    {
        int namelen = -1;
        int num = -1;
        char name[256]; // Assume no variable names longer than 256
        unsigned int type = GL_ZERO;

        // Get the name of the uniforms
        rf_gl.GetActiveUniform(shader.id, i,sizeof(name) - 1, &namelen, &num, &type, name);

        name[namelen] = 0;

        // Get the location of the named uniform
        unsigned int location = rf_gl.GetUniformLocation(shader.id, name);

        RF_LOG(RF_LOG_TYPE_DEBUG, "[SHDR ID %i] Active uniform [%s] set at location: %i", shader.id, name, location);
    }

    return shader;
}